

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_cont.c
# Opt level: O1

_light_pcapng_mem * light_no_copy_from_memory(uint32_t *memory,size_t size,int is_owner)

{
  uint *puVar1;
  size_t __nmemb;
  _light_pcapng_mem *p_Var2;
  size_t sVar3;
  uint32_t **ppuVar4;
  uint32_t *puVar5;
  size_t sVar6;
  
  p_Var2 = (_light_pcapng_mem *)calloc(1,0x28);
  p_Var2->mem = memory;
  p_Var2->mem_size = size;
  p_Var2->owner = is_owner;
  p_Var2->block_count = 0;
  if (size != 0) {
    sVar3 = 0;
    puVar5 = memory;
    do {
      sVar3 = sVar3 + 1;
      puVar1 = puVar5 + 1;
      puVar5 = (uint32_t *)((long)puVar5 + (ulong)(*puVar1 & 0xfffffffc));
      size = size - *puVar1;
    } while (size != 0);
    p_Var2->block_count = sVar3;
  }
  __nmemb = p_Var2->block_count;
  ppuVar4 = (uint32_t **)calloc(__nmemb,8);
  p_Var2->mem_blocks = ppuVar4;
  if (__nmemb != 0) {
    sVar6 = 0;
    do {
      ppuVar4[sVar6] = memory;
      memory = (uint32_t *)((long)memory + (ulong)(memory[1] & 0xfffffffc));
      sVar6 = sVar6 + 1;
    } while (__nmemb != sVar6);
  }
  return p_Var2;
}

Assistant:

struct _light_pcapng_mem *light_no_copy_from_memory(uint32_t *memory, size_t size, int is_owner)
{
	struct _light_pcapng_mem *head = NULL;
	head = calloc(1, sizeof(struct _light_pcapng_mem));
	__parse_mem_inplace(head, memory, size, is_owner);
	return head;
}